

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * kratos::fs::get_ext(string *__return_storage_ptr__,string *filename)

{
  allocator<char> local_21;
  long local_20;
  size_type idx;
  string *filename_local;
  
  idx = (size_type)filename;
  filename_local = __return_storage_ptr__;
  local_20 = std::__cxx11::string::rfind((char)filename,0x2e);
  if (local_20 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,idx);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_ext(const std::string &filename) {
#if defined(INCLUDE_FILESYSTEM)
    std::filesystem::path path(filename);
    return path.extension().string();
#else
    auto idx = filename.rfind('.');
    if (idx != std::string::npos)
        return filename.substr(idx);
    else
        return "";
#endif
}